

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

optional<bool> __thiscall
unodb::detail::olc_impl_helpers::
remove_or_choose_subtree<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
          (olc_impl_helpers *this,
          olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *inode,byte key_byte,basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k,
          olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
          *db_instance,read_critical_section *parent_critical_section,
          read_critical_section *node_critical_section,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          *node_in_parent,
          in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
          **child_in_parent,read_critical_section *child_critical_section,node_type *child_type,
          olc_node_ptr *child)

{
  long *plVar1;
  atomic<long> *paVar2;
  uintptr_t *puVar3;
  long lVar4;
  olc_impl_helpers oVar5;
  undefined8 uVar6;
  long *plVar7;
  long lVar8;
  optimistic_lock *poVar9;
  __int_type_conflict _Var10;
  __int_type_conflict _Var11;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar12;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar13;
  write_guard wVar14;
  bool bVar15;
  ushort uVar16;
  int iVar17;
  ulong uVar18;
  pthread_t pVar19;
  ulong uVar20;
  undefined7 in_register_00000011;
  uintptr_t uVar21;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *piVar22;
  ushort uVar23;
  ulong __n;
  write_guard local_70;
  write_guard child_guard_1;
  __atomic_base<unsigned_long> local_60;
  write_guard node_guard;
  write_guard local_48;
  write_guard node_guard_1;
  __atomic_base<unsigned_long> local_38;
  write_guard child_guard;
  
  uVar20 = k.field_0._0_8_;
  oVar5 = this[((ulong)inode & 0xffffffff) + 0x21];
  if (oVar5 == (olc_impl_helpers)0xff) {
    plVar7 = (long *)(db_instance->root_pointer_lock).version.version.
                     super___atomic_base<unsigned_long>._M_i;
    lVar8 = (db_instance->root_pointer_lock).read_lock_count.super___atomic_base<long>._M_i;
    if (plVar7[1] < 1) {
LAB_001b27f0:
      __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
    }
    LOCK();
    plVar1 = plVar7 + 1;
    lVar4 = *plVar1;
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (lVar8 == *plVar7) {
      if (lVar4 < 1) goto LAB_001b280f;
      (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
      poVar9 = parent_critical_section->lock;
      _Var10 = (parent_critical_section->version).version;
      if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001b27f0;
      _Var11 = (poVar9->version).version.super___atomic_base<unsigned_long>._M_i;
      LOCK();
      paVar2 = &poVar9->read_lock_count;
      uVar21 = (paVar2->super___atomic_base<long>)._M_i;
      (paVar2->super___atomic_base<long>)._M_i = (paVar2->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> **)
           parent_critical_section;
      if (_Var10 == _Var11) {
LAB_001b263b:
        if ((long)uVar21 < 1) goto LAB_001b280f;
        ((read_critical_section *)child_in_parent)->lock = (optimistic_lock *)0x0;
        uVar23 = 0x100;
        uVar16 = 0;
        goto LAB_001b2652;
      }
      if ((long)uVar21 < 1) goto LAB_001b280f;
      parent_critical_section->lock = (optimistic_lock *)0x0;
    }
    else {
      if (lVar4 < 1) goto LAB_001b280f;
      (db_instance->root_pointer_lock).version.version.super___atomic_base<unsigned_long>._M_i = 0;
    }
  }
  else {
    *(undefined8 *)child_type = *(undefined8 *)(this + (ulong)(byte)oVar5 * 8 + 0x140);
    node_guard_1.lock = &db_instance->root_pointer_lock;
    bVar15 = optimistic_lock::check
                       (parent_critical_section->lock,
                        (version_type)(parent_critical_section->version).version);
    if (bVar15) {
      child_guard_1.lock = k.field_0._8_8_;
      optimistic_lock::try_read_lock((optimistic_lock *)&stack0xffffffffffffffa0);
      *child_in_parent =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           local_60._M_i;
      local_60._M_i = 0;
      child_in_parent[1] =
           (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)
           node_guard.lock;
      optimistic_lock::read_critical_section::~read_critical_section
                ((read_critical_section *)&stack0xffffffffffffffa0);
      if (*child_in_parent !=
          (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_> *)0x0
         ) {
        uVar6 = *(undefined8 *)child_type;
        *(byte *)&child_critical_section->lock = (byte)uVar6 & 7;
        if ((uVar6 & (I256|I48)) == LEAF) {
          uVar18 = (ulong)*(uint *)((uVar6 & 0xfffffffffffffff8) + 0x18);
          __n = uVar20;
          if (uVar18 < uVar20) {
            __n = uVar18;
          }
          iVar17 = bcmp((void *)CONCAT71(in_register_00000011,key_byte),
                        (void *)((uVar6 & 0xfffffffffffffff8) + 0x20),__n);
          wVar14 = node_guard_1;
          if (iVar17 == 0 && uVar18 == uVar20) {
            if (this[0x20] == (olc_impl_helpers)0x11) {
              basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              ::
              make_db_inode_unique_ptr<unodb::detail::olc_inode_16<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::olc_inode_48<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&>
                        ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                          *)&stack0xffffffffffffffa0,(db_type *)child_guard_1.lock,
                         (olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                          *)this);
              bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)
                                  ((wVar14.lock)->version).version.
                                  super___atomic_base<unsigned_long>._M_i,
                                  (version_type)
                                  ((wVar14.lock)->read_lock_count).super___atomic_base<long>._M_i);
              local_38._M_i = 0;
              if (bVar15) {
                local_38._M_i =
                     ((wVar14.lock)->version).version.super___atomic_base<unsigned_long>._M_i;
              }
              ((wVar14.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              if (local_38._M_i != 0) {
                bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                   (parent_critical_section->lock,
                                    (version_type)(parent_critical_section->version).version);
                local_48.lock = (optimistic_lock *)0x0;
                if (bVar15) {
                  local_48.lock = parent_critical_section->lock;
                }
                parent_critical_section->lock = (optimistic_lock *)0x0;
                if (local_48.lock != (optimistic_lock *)0x0) {
                  bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                     ((optimistic_lock *)*child_in_parent,
                                      (version_type)child_in_parent[1]);
                  local_70.lock = (optimistic_lock *)0x0;
                  if (bVar15) {
                    local_70.lock = (optimistic_lock *)*child_in_parent;
                  }
                  *child_in_parent =
                       (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                        *)0x0;
                  if (local_70.lock != (optimistic_lock *)0x0) {
                    olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                    ::init((olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                            *)node_guard.lock,(EVP_PKEY_CTX *)child_guard_1.lock);
                    wVar14 = node_guard;
                    node_guard.lock = (optimistic_lock *)0x0;
                    if (((ulong)wVar14.lock & 7) != 0) {
                      __assert_fail("(result & ptr_bit_mask) == uintptr",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                                    ,0x182,
                                    "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                                   );
                    }
                    node_critical_section->lock = wVar14.lock | 2;
                    if (local_48.lock != (optimistic_lock *)0x0) {
                      __assert_fail("!node_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x644,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>]"
                                   );
                    }
                    if (local_70.lock != (optimistic_lock *)0x0) {
                      __assert_fail("!child_guard.active()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                                    ,0x645,
                                    "static std::optional<bool> unodb::detail::olc_impl_helpers::remove_or_choose_subtree(INode &, std::byte, basic_art_key<Key>, olc_db<Key, Value> &, optimistic_lock::read_critical_section &, optimistic_lock::read_critical_section &, in_critical_section<olc_node_ptr> *, in_critical_section<olc_node_ptr> **, optimistic_lock::read_critical_section *, node_type *, olc_node_ptr *) [Key = std::span<const std::byte>, Value = std::span<const std::byte>, INode = unodb::detail::olc_inode_48<std::span<const std::byte>, std::span<const std::byte>>]"
                                   );
                    }
                    (node_in_parent->value)._M_i.tagged_ptr = 0;
                    optimistic_lock::write_guard::~write_guard(&local_70);
                    optimistic_lock::write_guard::~write_guard(&local_48);
                    optimistic_lock::write_guard::~write_guard((write_guard *)&local_38);
                    std::
                    unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                   *)&stack0xffffffffffffffa0);
                    LOCK();
                    child_guard_1.lock[0x1b].read_lock_count.super___atomic_base<long>._M_i =
                         child_guard_1.lock[0x1b].read_lock_count.super___atomic_base<long>._M_i + 1
                    ;
                    UNLOCK();
                    goto LAB_001b23df;
                  }
                  optimistic_lock::write_guard::~write_guard(&local_70);
                }
                optimistic_lock::write_guard::~write_guard(&local_48);
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&local_38);
              std::
              unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
              ::~unique_ptr((unique_ptr<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::olc_inode_16<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             *)&stack0xffffffffffffffa0);
              goto LAB_001b27db;
            }
            plVar7 = (long *)((node_guard_1.lock)->version).version.
                             super___atomic_base<unsigned_long>._M_i;
            lVar8 = ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
            if (plVar7[1] < 1) goto LAB_001b27f0;
            LOCK();
            puVar3 = (uintptr_t *)(plVar7 + 1);
            uVar21 = *puVar3;
            *puVar3 = *puVar3 - 1;
            UNLOCK();
            wVar14 = node_guard_1;
            if (lVar8 == *plVar7) {
              if ((long)uVar21 < 1) goto LAB_001b280f;
              uVar23 = 0;
              ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                 (parent_critical_section->lock,
                                  (version_type)(parent_critical_section->version).version);
              local_60._M_i = 0;
              if (bVar15) {
                local_60._M_i = (__int_type_conflict)parent_critical_section->lock;
              }
              parent_critical_section->lock = (optimistic_lock *)0x0;
              if ((optimistic_lock *)local_60._M_i != (optimistic_lock *)0x0) {
                bVar15 = optimistic_lock::try_upgrade_to_write_lock
                                   ((optimistic_lock *)*child_in_parent,
                                    (version_type)child_in_parent[1]);
                uVar23 = 0;
                piVar22 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                           *)0x0;
                if (bVar15) {
                  piVar22 = *child_in_parent;
                }
                *child_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)0x0;
                local_38._M_i = (__int_type_conflict)piVar22;
                if (piVar22 !=
                    (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                     *)0x0) {
                  optimistic_lock::atomic_version_type::write_unlock_and_obsolete
                            ((atomic_version_type *)piVar22);
                  pVar19 = pthread_self();
                  ((__atomic_base<unsigned_long> *)&piVar22[2].value._M_i)->_M_i = pVar19;
                  local_38._M_i = 0;
                  olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                  ::remove((olc_inode_48<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                            *)this,(char *)((ulong)inode & 0xff));
                  (node_in_parent->value)._M_i.tagged_ptr = 0;
                  uVar23 = 0x100;
                }
                optimistic_lock::write_guard::~write_guard((write_guard *)&local_38);
              }
              optimistic_lock::write_guard::~write_guard((write_guard *)&stack0xffffffffffffffa0);
              goto LAB_001b257f;
            }
          }
          else {
            plVar7 = (long *)((node_guard_1.lock)->version).version.
                             super___atomic_base<unsigned_long>._M_i;
            lVar8 = ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
            if (plVar7[1] < 1) goto LAB_001b27f0;
            LOCK();
            puVar3 = (uintptr_t *)(plVar7 + 1);
            uVar21 = *puVar3;
            *puVar3 = *puVar3 - 1;
            UNLOCK();
            wVar14 = node_guard_1;
            if (lVar8 == *plVar7) {
              if ((long)uVar21 < 1) goto LAB_001b280f;
              ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
              poVar9 = parent_critical_section->lock;
              _Var10 = (parent_critical_section->version).version;
              if ((poVar9->read_lock_count).super___atomic_base<long>._M_i < 1) goto LAB_001b27f0;
              _Var11 = (poVar9->version).version.super___atomic_base<unsigned_long>._M_i;
              LOCK();
              paVar2 = &poVar9->read_lock_count;
              uVar21 = (paVar2->super___atomic_base<long>)._M_i;
              (paVar2->super___atomic_base<long>)._M_i =
                   (paVar2->super___atomic_base<long>)._M_i + -1;
              UNLOCK();
              wVar14.lock = (optimistic_lock *)parent_critical_section;
              if (_Var10 == _Var11) {
                if ((long)uVar21 < 1) goto LAB_001b280f;
                parent_critical_section->lock = (optimistic_lock *)0x0;
                piVar22 = *child_in_parent;
                piVar12 = child_in_parent[1];
                if ((long)piVar22[1].value._M_i.tagged_ptr < 1) goto LAB_001b27f0;
                piVar13 = (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                           *)(piVar22->value)._M_i.tagged_ptr;
                LOCK();
                piVar22 = piVar22 + 1;
                uVar21 = (piVar22->value)._M_i.tagged_ptr;
                (piVar22->value)._M_i.tagged_ptr = (piVar22->value)._M_i.tagged_ptr - 1;
                UNLOCK();
                wVar14.lock = (optimistic_lock *)child_in_parent;
                if (piVar12 == piVar13) goto LAB_001b263b;
              }
            }
          }
          parent_critical_section = (read_critical_section *)wVar14.lock;
          if ((long)uVar21 < 1) {
LAB_001b280f:
            __assert_fail("old_value > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                          ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
          }
          goto LAB_001b27d4;
        }
        (node_in_parent->value)._M_i.tagged_ptr = (uintptr_t)(this + (ulong)(byte)oVar5 * 8 + 0x140)
        ;
        plVar7 = (long *)((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>.
                         _M_i;
        lVar8 = ((node_guard_1.lock)->read_lock_count).super___atomic_base<long>._M_i;
        if (plVar7[1] < 1) goto LAB_001b27f0;
        LOCK();
        plVar1 = plVar7 + 1;
        lVar4 = *plVar1;
        *plVar1 = *plVar1 + -1;
        UNLOCK();
        if (lVar8 == *plVar7) {
          if (lVar4 < 1) goto LAB_001b280f;
          ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
LAB_001b23df:
          uVar23 = 0x100;
LAB_001b257f:
          uVar16 = 1;
          goto LAB_001b2652;
        }
        if (lVar4 < 1) goto LAB_001b280f;
        ((node_guard_1.lock)->version).version.super___atomic_base<unsigned_long>._M_i = 0;
      }
    }
    else {
LAB_001b27d4:
      (((optimistic_lock *)parent_critical_section)->version).version.
      super___atomic_base<unsigned_long>._M_i = 0;
    }
  }
LAB_001b27db:
  uVar16 = 0;
  uVar23 = 0;
LAB_001b2652:
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar23 | uVar16);
}

Assistant:

[[nodiscard]] std::optional<bool> olc_impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    olc_db<Key, Value>& db_instance,
    optimistic_lock::read_critical_section& parent_critical_section,
    optimistic_lock::read_critical_section& node_critical_section,
    in_critical_section<olc_node_ptr>* node_in_parent,
    in_critical_section<olc_node_ptr>** child_in_parent,
    optimistic_lock::read_critical_section* child_critical_section,
    node_type* child_type, olc_node_ptr* child) {
  const auto [child_i, found_child]{inode.find_child(key_byte)};

  if (found_child == nullptr) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  *child = found_child->load();

  if (UNODB_DETAIL_UNLIKELY(!node_critical_section.check())) return {};

  auto& child_lock{node_ptr_lock(*child)};
  *child_critical_section = child_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(child_critical_section->must_restart())) return {};

  *child_type = child->type();

  if (*child_type != node_type::LEAF) {
    *child_in_parent = found_child;
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    return true;
  }

  const auto* const leaf{child->ptr<olc_leaf_type<Key, Value>*>()};
  if (!leaf->matches(k)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE
    if (UNODB_DETAIL_UNLIKELY(!child_critical_section->try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    return false;
  }

  const auto is_node_min_size{inode.is_min_size()};

  if (UNODB_DETAIL_LIKELY(!is_node_min_size)) {
    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const optimistic_lock::write_guard node_guard{
        std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    child_guard.unlock_and_obsolete();

    inode.remove(child_i, db_instance);

    *child_in_parent = nullptr;
    return true;
  }

  UNODB_DETAIL_ASSERT(is_node_min_size);

  if constexpr (std::is_same_v<INode, olc_inode_4<Key, Value>>) {
    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    auto current_node{olc_art_policy<Key, Value>::make_db_inode_reclaimable_ptr(
        &inode, db_instance)};
    node_guard.unlock_and_obsolete();
    child_guard.unlock_and_obsolete();
    *node_in_parent = current_node->leave_last_child(child_i, db_instance);

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  } else {
    auto smaller_node{INode::smaller_derived_type::create(db_instance, inode)};

    const optimistic_lock::write_guard parent_guard{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

    optimistic_lock::write_guard node_guard{std::move(node_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

    optimistic_lock::write_guard child_guard{
        std::move(*child_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(child_guard.must_restart())) return {};

    smaller_node->init(db_instance, inode, node_guard, child_i, child_guard);
    *node_in_parent = detail::olc_node_ptr{smaller_node.release(),
                                           INode::smaller_derived_type::type};

    UNODB_DETAIL_ASSERT(!node_guard.active());
    UNODB_DETAIL_ASSERT(!child_guard.active());

    *child_in_parent = nullptr;
  }

#ifdef UNODB_DETAIL_WITH_STATS
  db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS

  return true;
}